

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitput.c
# Opt level: O3

RK_S32 mpp_set_bitput_ctx(BitputCtx_t *bp,RK_U64 *data,RK_U32 len)

{
  bp->bvalue = 0;
  bp->bitpos = '\0';
  *(undefined3 *)&bp->field_0x19 = 0;
  bp->size = 0;
  bp->buflen = 0;
  bp->index = 0;
  bp->pbuf = (RK_U64 *)0x0;
  bp->size = len;
  bp->buflen = len;
  bp->pbuf = data;
  return 0;
}

Assistant:

RK_S32 mpp_set_bitput_ctx(BitputCtx_t *bp, RK_U64 *data, RK_U32 len)
{
    memset(bp, 0, sizeof(BitputCtx_t));
    bp->index  = 0;
    bp->bitpos = 0;
    bp->bvalue = 0;
    bp->size   = len;
    bp->buflen = len;  // align 64bit
    bp->pbuf   = data;
    return 0;
}